

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O3

lzma_ret lz_encode(lzma_coder_conflict14 *coder,lzma_allocator *allocator,uint8_t *in,size_t *in_pos
                  ,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  uint32_t *puVar1;
  uint uVar2;
  uint8_t *__dest;
  lzma_code_function_conflict12 p_Var3;
  ulong uVar4;
  lzma_ret lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong local_58;
  ulong local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  lzma_allocator *local_38;
  
  local_50 = in_size;
  local_40 = in;
  local_38 = allocator;
  do {
    if (out_size <= *out_pos) {
      return LZMA_OK;
    }
    if ((action == LZMA_RUN) && (local_50 <= *in_pos)) {
      return LZMA_OK;
    }
    if (((coder->mf).action == LZMA_RUN) &&
       (uVar6 = (coder->mf).read_pos, (coder->mf).read_limit <= uVar6)) {
      uVar7 = (coder->mf).write_pos;
      if (uVar7 < uVar6) {
        __assert_fail("coder->mf.read_pos <= coder->mf.write_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                      ,0x57,
                      "lzma_ret fill_window(lzma_coder *, lzma_allocator *, const uint8_t *, size_t *, size_t, lzma_action)"
                     );
      }
      uVar2 = (coder->mf).size;
      if (uVar2 - (coder->mf).keep_size_after <= uVar6) {
        puVar1 = &(coder->mf).keep_size_before;
        uVar8 = uVar6 - *puVar1;
        if (uVar6 < *puVar1 || uVar8 == 0) {
          __assert_fail("mf->read_pos > mf->keep_size_before",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x35,"void move_window(lzma_mf *)");
        }
        uVar8 = uVar8 & 0xfffffff0;
        uVar6 = uVar7 - uVar8;
        if (uVar7 < uVar8 || uVar6 == 0) {
          __assert_fail("mf->write_pos > move_offset",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x38,"void move_window(lzma_mf *)");
        }
        if ((ulong)uVar2 < (ulong)uVar6 + (ulong)uVar8) {
          __assert_fail("move_offset + move_size <= mf->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x3b,"void move_window(lzma_mf *)");
        }
        __dest = (coder->mf).buffer;
        memmove(__dest,__dest + uVar8,(ulong)uVar6);
        puVar1 = &(coder->mf).offset;
        *puVar1 = *puVar1 + uVar8;
        puVar1 = &(coder->mf).read_pos;
        *puVar1 = *puVar1 - uVar8;
        puVar1 = &(coder->mf).read_limit;
        *puVar1 = *puVar1 - uVar8;
        uVar7 = (coder->mf).write_pos - uVar8;
        (coder->mf).write_pos = uVar7;
      }
      uVar4 = local_50;
      local_58 = (ulong)uVar7;
      p_Var3 = (coder->next).code;
      if (p_Var3 == (lzma_code_function_conflict12)0x0) {
        local_48 = out;
        lzma_bufcpy(local_40,in_pos,local_50,(coder->mf).buffer,&local_58,(ulong)(coder->mf).size);
        out = local_48;
        if (action != LZMA_RUN) {
          lVar5 = (lzma_ret)(*in_pos == uVar4);
          goto LAB_0045fc7f;
        }
        (coder->mf).write_pos = (uint)local_58;
        lVar5 = LZMA_OK;
LAB_0045fcc6:
        puVar1 = &(coder->mf).keep_size_after;
        uVar6 = (uint)local_58 - *puVar1;
        if (*puVar1 <= (uint)local_58 && uVar6 != 0) goto LAB_0045fccd;
      }
      else {
        lVar5 = (*p_Var3)((coder->next).coder,local_38,local_40,in_pos,local_50,(coder->mf).buffer,
                          &local_58,(ulong)(coder->mf).size,action);
LAB_0045fc7f:
        (coder->mf).write_pos = (uint)local_58;
        if (lVar5 != LZMA_STREAM_END) goto LAB_0045fcc6;
        if (*in_pos != local_50) {
          __assert_fail("*in_pos == in_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x77,
                        "lzma_ret fill_window(lzma_coder *, lzma_allocator *, const uint8_t *, size_t *, size_t, lzma_action)"
                       );
        }
        (coder->mf).action = action;
        lVar5 = LZMA_OK;
        uVar6 = (uint)local_58;
LAB_0045fccd:
        (coder->mf).read_limit = uVar6;
      }
      uVar6 = (coder->mf).pending;
      if ((uVar6 != 0) && (uVar7 = (coder->mf).read_pos, uVar7 < (coder->mf).read_limit)) {
        (coder->mf).pending = 0;
        if (uVar7 < uVar6) {
          __assert_fail("coder->mf.read_pos >= pending",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x8e,
                        "lzma_ret fill_window(lzma_coder *, lzma_allocator *, const uint8_t *, size_t *, size_t, lzma_action)"
                       );
        }
        (coder->mf).read_pos = uVar7 - uVar6;
        (*(coder->mf).skip)(&coder->mf,uVar6);
      }
      if (lVar5 != LZMA_OK) {
        return lVar5;
      }
    }
    lVar5 = (*(coder->lz).code)((coder->lz).coder,&coder->mf,out,out_pos,out_size);
    if (lVar5 != LZMA_OK) {
      (coder->mf).action = LZMA_RUN;
      return lVar5;
    }
  } while( true );
}

Assistant:

static lzma_ret
lz_encode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size,
		uint8_t *LZMA_RESTRICT out, size_t *LZMA_RESTRICT out_pos,
		size_t out_size, lzma_action action)
{
	while (*out_pos < out_size
			&& (*in_pos < in_size || action != LZMA_RUN)) {
		lzma_ret ret;

		// Read more data to coder->mf.buffer if needed.
		if (coder->mf.action == LZMA_RUN && coder->mf.read_pos
				>= coder->mf.read_limit)
			return_if_error(fill_window(coder, allocator,
					in, in_pos, in_size, action));

		// Encode
		ret = coder->lz.code(coder->lz.coder,
				&coder->mf, out, out_pos, out_size);
		if (ret != LZMA_OK) {
			// Setting this to LZMA_RUN for cases when we are
			// flushing. It doesn't matter when finishing or if
			// an error occurred.
			coder->mf.action = LZMA_RUN;
			return ret;
		}
	}

	return LZMA_OK;
}